

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O2

int lws_b64_decode_stateful
              (lws_b64state *s,char *in,size_t *in_len,uint8_t *out,size_t *out_size,int final)

{
  size_t sVar1;
  byte bVar2;
  char cVar3;
  uchar uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  byte *pbVar8;
  int iVar9;
  bool bVar10;
  byte *pbVar11;
  int iVar12;
  int local_40;
  
  iVar9 = (int)in;
  pbVar11 = (byte *)(in + *in_len);
  sVar1 = *out_size;
  pbVar8 = out;
  do {
LAB_00135702:
    do {
      if (((pbVar11 <= in) || (*in == 0)) || (out + sVar1 <= pbVar8 + 4)) {
        *pbVar8 = 0;
        *in_len = (ulong)(uint)((int)in - iVar9);
        local_40 = (int)out;
        *out_size = (ulong)(uint)((int)pbVar8 - local_40);
        return 0;
      }
      iVar12 = s->i;
LAB_00135722:
      if ((in < pbVar11) && (iVar12 < 4)) {
        if (*in != 0) {
          s->c = 0;
          bVar10 = true;
          do {
            cVar3 = '\0';
            do {
              if (((pbVar11 <= in) || (cVar3 != '\0')) || (bVar2 = *in, bVar2 == 0)) {
                if (bVar10) {
                  uVar4 = '\0';
LAB_001357b2:
                  s->quad[iVar12] = uVar4;
                }
                else {
                  s->len = s->len + 1;
                  if (cVar3 != '\0') {
                    uVar4 = cVar3 + 0xff;
                    goto LAB_001357b2;
                  }
                }
                iVar12 = s->i + 1;
                s->i = iVar12;
                goto LAB_00135722;
              }
              if (bVar2 == 0x2d) {
                bVar2 = 0x2b;
              }
              bVar6 = 0x2f;
              if (bVar2 != 0x5f) {
                bVar6 = bVar2;
              }
              in = (char *)((byte *)in + 1);
              s->c = (uint)bVar6;
              if ((byte)(bVar6 + 0x85) < 0xb0) break;
              uVar7 = bVar6 - 0x2b;
              if ("|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                  [uVar7] == '$') {
                cVar3 = '\0';
              }
              else {
                cVar3 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                        [uVar7] + -0x3d;
              }
              bVar10 = false;
            } while (uVar7 != 0x50);
            bVar10 = false;
          } while( true );
        }
        if (final == 0) goto LAB_00135702;
        s->i = 0;
        goto LAB_001357f1;
      }
    } while ((final == 0) && (iVar12 != 4));
    s->i = 0;
    if (in < pbVar11) {
LAB_001357f1:
      uVar5 = s->len;
      if (*in == 0) goto LAB_00135801;
    }
    else {
      uVar5 = s->len;
LAB_00135801:
      if (s->c == 0x3d) {
        uVar5 = uVar5 - 1;
        s->len = uVar5;
      }
    }
    if (1 < uVar5) {
      *pbVar8 = s->quad[1] >> 4 | s->quad[0] << 2;
      uVar5 = s->len;
      if (uVar5 < 3) {
        pbVar8 = pbVar8 + 1;
      }
      else {
        pbVar8[1] = s->quad[2] >> 2 | s->quad[1] << 4;
        uVar5 = s->len;
        if (uVar5 < 4) {
          pbVar8 = pbVar8 + 2;
        }
        else {
          pbVar8[2] = s->quad[2] << 6 | s->quad[3];
          pbVar8 = pbVar8 + 3;
          uVar5 = s->len;
        }
      }
    }
    s->done = (uVar5 + s->done) - 1;
    s->len = 0;
  } while( true );
}

Assistant:

int
lws_b64_decode_stateful(struct lws_b64state *s, const char *in, size_t *in_len,
			uint8_t *out, size_t *out_size, int final)
{
	const char *orig_in = in, *end_in = in + *in_len;
	uint8_t *orig_out = out, *end_out = out + *out_size;

	while (in < end_in && *in && out + 4 < end_out) {

		for (; s->i < 4 && in < end_in && *in; s->i++) {
			uint8_t v;

			v = 0;
			s->c = 0;
			while (in < end_in && *in && !v) {
				s->c = v = (unsigned char)*in++;
				/* support the url base64 variant too */
				if (v == '-')
					s->c = v = '+';
				if (v == '_')
					s->c = v = '/';
				v = (uint8_t)((v < 43 || v > 122) ? 0 : decode[v - 43]);
				if (v)
					v = (uint8_t)((v == '$') ? 0 : v - 61);
			}
			if (s->c) {
				s->len++;
				if (v)
					s->quad[s->i] = (uint8_t)(v - 1);
			} else
				s->quad[s->i] = 0;
		}

		if (s->i != 4 && !final)
			continue;

		s->i = 0;

		/*
		 * "The '==' sequence indicates that the last group contained
		 * only one byte, and '=' indicates that it contained two
		 * bytes." (wikipedia)
		 */

		if ((in >= end_in || !*in) && s->c == '=')
			s->len--;

		if (s->len >= 2)
			*out++ = (uint8_t)(s->quad[0] << 2 | s->quad[1] >> 4);
		if (s->len >= 3)
			*out++ = (uint8_t)(s->quad[1] << 4 | s->quad[2] >> 2);
		if (s->len >= 4)
			*out++ = (uint8_t)(((s->quad[2] << 6) & 0xc0) | s->quad[3]);

		s->done += s->len - 1;
		s->len = 0;
	}

	*out = '\0';
	*in_len = (unsigned int)(in - orig_in);
	*out_size = (unsigned int)(out - orig_out);

	return 0;
}